

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int check_type_union_leafref(lys_type *type)

{
  int iVar1;
  byte local_19;
  uint8_t i;
  lys_type *type_local;
  
  if ((type->base == LY_TYPE_UNION) && ((type->info).bits.count != 0)) {
    for (local_19 = 0; (uint)local_19 < (type->info).bits.count; local_19 = local_19 + 1) {
      iVar1 = *(int *)((long)(type->info).bits.bit + (ulong)local_19 * 0x40);
      if (iVar1 == 9) {
        return 1;
      }
      if ((iVar1 == 0xb) &&
         (iVar1 = check_type_union_leafref
                            ((lys_type *)((long)(type->info).bits.bit + (ulong)local_19 * 0x40)),
         iVar1 != 0)) {
        return 1;
      }
    }
    type_local._4_4_ = 0;
  }
  else {
    type_local._4_4_ = (uint)type->der->has_union_leafref;
  }
  return type_local._4_4_;
}

Assistant:

static int
check_type_union_leafref(struct lys_type *type)
{
    uint8_t i;

    if ((type->base == LY_TYPE_UNION) && type->info.uni.count) {
        /* go through unions and look for leafref */
        for (i = 0; i < type->info.uni.count; ++i) {
            switch (type->info.uni.types[i].base) {
            case LY_TYPE_LEAFREF:
                return 1;
            case LY_TYPE_UNION:
                if (check_type_union_leafref(&type->info.uni.types[i])) {
                    return 1;
                }
                break;
            default:
                break;
            }
        }

        return 0;
    }

    /* just inherit the flag value */
    return type->der->has_union_leafref;
}